

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O2

Frustum<float> * __thiscall
Imath_3_2::Frustum<float>::operator=(Frustum<float> *this,Frustum<float> *f)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = f->_farPlane;
  fVar2 = f->_left;
  fVar3 = f->_right;
  this->_nearPlane = f->_nearPlane;
  this->_farPlane = fVar1;
  this->_left = fVar2;
  this->_right = fVar3;
  fVar1 = f->_bottom;
  this->_top = f->_top;
  this->_bottom = fVar1;
  this->_orthographic = f->_orthographic;
  return this;
}

Assistant:

IMATH_CONSTEXPR14 inline const Frustum<T>&
Frustum<T>::operator= (const Frustum& f) IMATH_NOEXCEPT
{
    _nearPlane    = f._nearPlane;
    _farPlane     = f._farPlane;
    _left         = f._left;
    _right        = f._right;
    _top          = f._top;
    _bottom       = f._bottom;
    _orthographic = f._orthographic;

    return *this;
}